

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_nearest_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int x;
  int *offset_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined4 local_3a4;
  int local_324;
  int *local_2d8;
  undefined4 *local_288;
  int local_230;
  
  lVar6 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar7 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_230 = 0; local_230 < (int)lVar6; local_230 = local_230 + 1) {
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    local_288 = (undefined4 *)(*in_RSI + in_RSI[8] * (long)local_230 * in_RSI[2]);
    local_2d8 = (int *)*in_RDX;
    for (local_324 = 0; local_324 < iVar1 * (int)lVar7 * iVar2; local_324 = local_324 + 1) {
      if (*local_2d8 < 0) {
        local_3a4 = 0;
      }
      else {
        local_3a4 = *(undefined4 *)(lVar3 + lVar4 * local_230 * lVar5 + (long)*local_2d8 * 4);
      }
      *local_288 = local_3a4;
      local_2d8 = local_2d8 + 1;
      local_288 = local_288 + 1;
    }
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p1(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            *dstptr = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;

            offset_ptr++;
            dstptr++;
        }
    }
}